

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attach_info.cpp
# Opt level: O2

StorageOptions * __thiscall
duckdb::AttachInfo::GetStorageOptions(StorageOptions *__return_storage_ptr__,AttachInfo *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  uint64_t uVar4;
  __node_base *p_Var5;
  idx_t local_b8;
  pointer local_b0;
  allocator local_99;
  StorageOptions *local_98;
  idx_t local_90;
  optional_idx local_88;
  SerializationCompatibility local_80;
  string local_50;
  
  *(undefined4 *)&(__return_storage_ptr__->storage_version).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->storage_version).index + 4) = 0xffffffff;
  *(undefined4 *)&(__return_storage_ptr__->block_header_size).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->block_header_size).index + 4) = 0xffffffff;
  *(undefined4 *)&(__return_storage_ptr__->block_alloc_size).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->block_alloc_size).index + 4) = 0xffffffff;
  *(undefined4 *)&(__return_storage_ptr__->row_group_size).index = 0xffffffff;
  *(undefined4 *)((long)&(__return_storage_ptr__->row_group_size).index + 4) = 0xffffffff;
  p_Var5 = &(this->options)._M_h._M_before_begin;
  bVar2 = false;
  local_b0 = (pointer)0xffffffffffffffff;
  local_b8 = 0xffffffffffffffff;
  local_90 = 0xffffffffffffffff;
  local_98 = __return_storage_ptr__;
  _Var3._M_p = (pointer)0xffffffffffffffff;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 1);
    bVar1 = ::std::operator==(__lhs,"block_size");
    if (bVar1) {
      uVar4 = Value::GetValue<unsigned_long>((Value *)(p_Var5 + 5));
      optional_idx::optional_idx((optional_idx *)&local_80,uVar4);
      _Var3._M_p = local_80.duckdb_version._M_dataplus._M_p;
    }
    else {
      bVar1 = ::std::operator==(__lhs,"encryption_key");
      if (bVar1) {
        ::std::__cxx11::string::string((string *)&local_50,"v1.3.0",&local_99);
        SerializationCompatibility::FromString(&local_80,&local_50);
        optional_idx::optional_idx(&local_88,local_80.serialization_version);
        local_b8 = local_88.index;
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::__cxx11::string::~string((string *)&local_50);
        bVar2 = true;
        local_90 = 0x28;
      }
      else {
        bVar1 = ::std::operator==(__lhs,"row_group_size");
        if (bVar1) {
          uVar4 = Value::GetValue<unsigned_long>((Value *)(p_Var5 + 5));
          optional_idx::optional_idx((optional_idx *)&local_80,uVar4);
          local_b0 = local_80.duckdb_version._M_dataplus._M_p;
        }
        else {
          bVar1 = ::std::operator==(__lhs,"storage_version");
          if (bVar1) {
            Value::ToString_abi_cxx11_(&local_50,(Value *)(p_Var5 + 5));
            SerializationCompatibility::FromString(&local_80,&local_50);
            optional_idx::optional_idx(&local_88,local_80.serialization_version);
            local_b8 = local_88.index;
            ::std::__cxx11::string::~string((string *)&local_80);
            ::std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
    }
  }
  (local_98->storage_version).index = local_b8;
  (local_98->row_group_size).index = (idx_t)local_b0;
  (local_98->block_header_size).index = local_90;
  local_98->encryption = bVar2;
  (local_98->block_alloc_size).index = (idx_t)_Var3._M_p;
  return local_98;
}

Assistant:

StorageOptions AttachInfo::GetStorageOptions() const {
	StorageOptions storage_options;
	for (auto &entry : options) {
		if (entry.first == "block_size") {
			// Extract the block allocation size. This is NOT the actual memory available on a block (block_size),
			// even though the corresponding option we expose to the user is called "block_size".
			storage_options.block_alloc_size = entry.second.GetValue<uint64_t>();
		} else if (entry.first == "encryption_key") {
			storage_options.block_header_size = DEFAULT_ENCRYPTION_BLOCK_HEADER_SIZE;
			storage_options.encryption = true;
			// set storage version to v1.3.0
			storage_options.storage_version = SerializationCompatibility::FromString("v1.3.0").serialization_version;
		} else if (entry.first == "row_group_size") {
			storage_options.row_group_size = entry.second.GetValue<uint64_t>();
		} else if (entry.first == "storage_version") {
			storage_options.storage_version =
			    SerializationCompatibility::FromString(entry.second.ToString()).serialization_version;
		}
	}
	return storage_options;
}